

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

void Luv32fromLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  ushort uVar1;
  int iVar2;
  long lVar3;
  uint *puVar4;
  double dVar5;
  double dVar6;
  
  puVar4 = (uint *)sp->tbuf;
  if (sp->encode_meth == 0) {
    if (0 < n) {
      lVar3 = n + 1;
      do {
        *puVar4 = (uint)((short)*(ushort *)((long)op + 4) * 0x19a) >> 0xf & 0xff |
                  (uint)((short)*(ushort *)((long)op + 2) * 0x19a) >> 7 & 0xff00 |
                  (uint)*(ushort *)op << 0x10;
        puVar4 = puVar4 + 1;
        op = (uint8_t *)((long)op + 6);
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
  }
  else if (0 < n) {
    lVar3 = n + 1;
    do {
      uVar1 = *(ushort *)op;
      dVar5 = (double)(int)(short)*(ushort *)((long)op + 2) * 0.01251220703125;
      if (sp->encode_meth != 0) {
        iVar2 = rand();
        dVar5 = (double)iVar2 * 4.656612875245797e-10 + dVar5 + -0.5;
      }
      dVar6 = (double)(int)(short)*(ushort *)((long)op + 4) * 0.01251220703125;
      if (sp->encode_meth != 0) {
        iVar2 = rand();
        dVar6 = (double)iVar2 * 4.656612875245797e-10 + dVar6 + -0.5;
      }
      *puVar4 = (int)dVar6 & 0xffU | ((int)dVar5 & 0xffU) << 8 | (uint)uVar1 << 0x10;
      puVar4 = puVar4 + 1;
      op = (uint8_t *)((long)op + 6);
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  return;
}

Assistant:

static void Luv32fromLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    if (sp->encode_meth == SGILOGENCODE_NODITHER)
    {
        while (n-- > 0)
        {
            *luv++ = (uint32_t)luv3[0] << 16 |
                     (luv3[1] * (uint32_t)(UVSCALE + .5) >> 7 & 0xff00) |
                     (luv3[2] * (uint32_t)(UVSCALE + .5) >> 15 & 0xff);
            luv3 += 3;
        }
        return;
    }
    while (n-- > 0)
    {
        *luv++ =
            (uint32_t)luv3[0] << 16 |
            (tiff_itrunc(luv3[1] * (UVSCALE / (1 << 15)), sp->encode_meth)
                 << 8 &
             0xff00) |
            (tiff_itrunc(luv3[2] * (UVSCALE / (1 << 15)), sp->encode_meth) &
             0xff);
        luv3 += 3;
    }
}